

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State>::
emplaceRealloc<slang::ast::RecursiveStructMemberIterator::State&>
          (SmallVectorBase<slang::ast::RecursiveStructMemberIterator::State> *this,pointer pos,
          State *args)

{
  size_t *psVar1;
  ulong uVar2;
  pointer p;
  ConstantValue *pCVar3;
  Type *pTVar4;
  FieldSymbol **ppFVar5;
  pointer pSVar6;
  long lVar7;
  pointer pSVar8;
  pointer pSVar9;
  long lVar10;
  size_type sVar11;
  ulong uVar12;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar2 = this->cap;
  if (uVar12 < uVar2 * 2) {
    uVar12 = uVar2 * 2;
  }
  if (0x333333333333333 - uVar2 < uVar2) {
    uVar12 = 0x333333333333333;
  }
  lVar10 = (long)pos - (long)this->data_;
  pSVar6 = (pointer)operator_new(uVar12 * 0x28);
  *(FieldSymbol ***)((long)pSVar6 + lVar10 + 0x20) = (args->fieldEnd)._M_current;
  pCVar3 = args->val;
  pTVar4 = args->type;
  ppFVar5 = (args->fieldIt)._M_current;
  psVar1 = (size_t *)((long)pSVar6 + lVar10 + 0x10);
  *psVar1 = args->valIndex;
  psVar1[1] = (size_t)ppFVar5;
  *(undefined8 *)((long)pSVar6 + lVar10) = pCVar3;
  ((undefined8 *)((long)pSVar6 + lVar10))[1] = pTVar4;
  p = this->data_;
  sVar11 = this->len;
  lVar7 = (long)p + (sVar11 * 0x28 - (long)pos);
  pSVar8 = p;
  pSVar9 = pSVar6;
  if (lVar7 == 0) {
    pSVar8 = pSVar6;
    pSVar9 = p;
    if (sVar11 != 0) {
      do {
        (pSVar8->fieldEnd)._M_current = (pSVar9->fieldEnd)._M_current;
        pCVar3 = pSVar9->val;
        pTVar4 = pSVar9->type;
        ppFVar5 = (pSVar9->fieldIt)._M_current;
        pSVar8->valIndex = pSVar9->valIndex;
        (pSVar8->fieldIt)._M_current = ppFVar5;
        pSVar8->val = pCVar3;
        pSVar8->type = pTVar4;
        pSVar9 = pSVar9 + 1;
        pSVar8 = pSVar8 + 1;
      } while (pSVar9 != pos);
    }
  }
  else {
    for (; pSVar8 != pos; pSVar8 = pSVar8 + 1) {
      (pSVar9->fieldEnd)._M_current = (pSVar8->fieldEnd)._M_current;
      pCVar3 = pSVar8->val;
      pTVar4 = pSVar8->type;
      ppFVar5 = (pSVar8->fieldIt)._M_current;
      pSVar9->valIndex = pSVar8->valIndex;
      (pSVar9->fieldIt)._M_current = ppFVar5;
      pSVar9->val = pCVar3;
      pSVar9->type = pTVar4;
      pSVar9 = pSVar9 + 1;
    }
    memcpy((void *)((long)pSVar6 + lVar10 + 0x28),pos,((lVar7 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar11 = this->len;
  }
  this->len = sVar11 + 1;
  this->cap = uVar12;
  this->data_ = pSVar6;
  return (pointer)((long)pSVar6 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}